

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O3

void __thiscall
IRBuilderAsmJs::BuildLong2
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot srcRegSlot)

{
  code *pcVar1;
  bool bVar2;
  ValueType VVar3;
  RegOpnd *this_00;
  RegOpnd *this_01;
  undefined4 *puVar4;
  IntConstOpnd *src2Opnd;
  Instr *instr;
  Func *pFVar5;
  int iVar6;
  IRType type;
  undefined6 in_register_00000032;
  OpCode opcode;
  IntConstType value;
  
  this_00 = BuildSrcOpnd(this,srcRegSlot,TyInt64);
  VVar3 = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&this_00->super_Opnd,VVar3);
  this_01 = BuildDstOpnd(this,dstRegSlot,TyInt64);
  VVar3 = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&this_01->super_Opnd,VVar3);
  iVar6 = (int)CONCAT62(in_register_00000032,newOpcode);
  if (0x86 < iVar6) {
    if (iVar6 == 0x87) {
      pFVar5 = this->m_func;
      opcode = InlineMathClz;
    }
    else if (iVar6 == 0x88) {
      pFVar5 = this->m_func;
      opcode = Ctz;
    }
    else {
      if (iVar6 != 0x89) goto switchD_004fb43a_caseD_45;
      pFVar5 = this->m_func;
      opcode = PopCnt;
    }
LAB_004fb563:
    instr = IR::Instr::New(opcode,&this_01->super_Opnd,&this_00->super_Opnd,pFVar5);
    goto LAB_004fb571;
  }
  switch(iVar6) {
  case 0x44:
    instr = IR::Instr::New(Ld_I4,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func);
    CheckJitLoopReturn(this,dstRegSlot,TyInt64);
    goto LAB_004fb571;
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
    goto switchD_004fb43a_caseD_45;
  case 0x4a:
    pFVar5 = this->m_func;
    value = 1;
    type = TyInt8;
    break;
  case 0x4b:
    pFVar5 = this->m_func;
    value = 2;
    type = TyInt16;
    break;
  case 0x4c:
    pFVar5 = this->m_func;
    value = 3;
    type = TyInt32;
    break;
  default:
    if (iVar6 == 0xc) {
      pFVar5 = this->m_func;
      opcode = Ld_I4;
      goto LAB_004fb563;
    }
    goto switchD_004fb43a_caseD_45;
  }
  src2Opnd = IR::IntConstOpnd::New(value,type,pFVar5,false);
  instr = IR::Instr::New(Conv_Prim,&this_01->super_Opnd,&this_00->super_Opnd,&src2Opnd->super_Opnd,
                         this->m_func);
LAB_004fb571:
  AddInstr(this,instr,offset);
  return;
switchD_004fb43a_caseD_45:
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar4 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                     ,0xc55,"((0))","(0)");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
  instr = (Instr *)0x0;
  goto LAB_004fb571;
}

Assistant:

void
IRBuilderAsmJs::BuildLong2(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot srcRegSlot)
{
    IR::RegOpnd * srcOpnd = BuildSrcOpnd(srcRegSlot, TyInt64);
    srcOpnd->SetValueType(ValueType::GetInt(false));

    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TyInt64);
    dstOpnd->SetValueType(ValueType::GetInt(false));

    IR::Instr * instr = nullptr;
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::Ld_Long:
        instr = IR::Instr::New(Js::OpCode::Ld_I4, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::Clz_Long:
        instr = IR::Instr::New(Js::OpCode::InlineMathClz, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::Ctz_Long:
        instr = IR::Instr::New(Js::OpCode::Ctz, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::PopCnt_Long:
        instr = IR::Instr::New(Js::OpCode::PopCnt, dstOpnd, srcOpnd, m_func);
        break;

    case Js::OpCodeAsmJs::Return_Long:
        instr = IR::Instr::New(Js::OpCode::Ld_I4, dstOpnd, srcOpnd, m_func);
        CheckJitLoopReturn(dstRegSlot, TyInt64);
        break;
    case Js::OpCodeAsmJs::I64Extend8_s:
        instr = CreateSignExtendInstr(dstOpnd, srcOpnd, TyInt8);
        break;
    case Js::OpCodeAsmJs::I64Extend16_s:
        instr = CreateSignExtendInstr(dstOpnd, srcOpnd, TyInt16);
        break;
    case Js::OpCodeAsmJs::I64Extend32_s:
        instr = CreateSignExtendInstr(dstOpnd, srcOpnd, TyInt32);
        break;
    default:
        Assume(UNREACHED);
    }
    AddInstr(instr, offset);
}